

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

Fl_Widget * make_widget_browser(int x,int y,int w,int h)

{
  Fl_Widget *this;
  
  this = (Fl_Widget *)operator_new(0x268);
  Widget_Browser::Widget_Browser((Widget_Browser *)this,x,y,w,h,(char *)0x0);
  widget_browser = (Widget_Browser *)this;
  return this;
}

Assistant:

Fl_Widget *make_widget_browser(int x,int y,int w,int h) {
  return (widget_browser = new Widget_Browser(x,y,w,h));
}